

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O3

void __thiscall
TEST_MinipointCounterTest_HighestPoints_TestShell::
~TEST_MinipointCounterTest_HighestPoints_TestShell
          (TEST_MinipointCounterTest_HighestPoints_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MinipointCounterTest, HighestPoints)
{
	s.setRoundWind(Tile::EastWind);
	s.setSeatWind(Tile::EastWind);

	addQuad(Tile::OneOfCharacters, false);
	addQuad(Tile::RedDragon, false);
	addQuad(Tile::SouthWind, true);
	addSequence(Tile::SevenOfCircles, false);
	addPair(Tile::EastWind);

	s.selfDrawn();

	CHECK_EQUAL(108, m.total(false));
	CHECK_EQUAL(110, m.total());
}